

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

bool flatbuffers::StringToIntegerImpl<unsigned_long>
               (unsigned_long *val,char *str,int base,bool check_errno)

{
  byte bVar1;
  int *piVar2;
  byte *pbVar3;
  ulonglong uVar4;
  char *endptr;
  char *local_30;
  
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                  ,0x11f,
                  "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = unsigned long]"
                 );
  }
  pbVar3 = (byte *)str;
  if (base < 1) {
    do {
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
      if (bVar1 == 0) break;
    } while (9 < (int)(char)bVar1 - 0x30U);
    if ((bVar1 == 0x30) && ((*pbVar3 & 0xdf) == 0x58)) {
      if (check_errno) {
        piVar2 = __errno_location();
        *piVar2 = 0;
      }
      base = 0x10;
    }
    else {
      if (check_errno) {
        piVar2 = __errno_location();
        *piVar2 = 0;
      }
      base = 10;
    }
  }
  else if (check_errno) {
    piVar2 = __errno_location();
    *piVar2 = 0;
  }
  local_30 = str;
  uVar4 = strtoull_l(str,&local_30,base,ClassicLocale::instance_);
  *val = uVar4;
  if ((local_30 == str) || (*local_30 != '\0')) {
    *val = 0;
  }
  else if ((!check_errno) || (piVar2 = __errno_location(), *piVar2 == 0)) {
    return true;
  }
  return false;
}

Assistant:

inline bool StringToIntegerImpl(T *val, const char *const str,
                                const int base = 0,
                                const bool check_errno = true) {
  // T is int64_t or uint64_T
  FLATBUFFERS_ASSERT(str);
  if (base <= 0) {
    auto s = str;
    while (*s && !is_digit(*s)) s++;
    if (s[0] == '0' && is_alpha_char(s[1], 'X'))
      return StringToIntegerImpl(val, str, 16, check_errno);
    // if a prefix not match, try base=10
    return StringToIntegerImpl(val, str, 10, check_errno);
  } else {
    if (check_errno) errno = 0;  // clear thread-local errno
    auto endptr = str;
    strtoval_impl(val, str, const_cast<char **>(&endptr), base);
    if ((*endptr != '\0') || (endptr == str)) {
      *val = 0;      // erase partial result
      return false;  // invalid string
    }
    // errno is out-of-range, return MAX/MIN
    if (check_errno && errno) return false;
    return true;
  }
}